

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O0

MaybeResult<wasm::Ok> *
wasm::WATParser::table<wasm::WATParser::ParseDeclsCtx>
          (MaybeResult<wasm::Ok> *__return_storage_ptr__,ParseDeclsCtx *ctx)

{
  __index_type *__return_storage_ptr___00;
  Name name_00;
  bool bVar1;
  bool bVar2;
  size_t sVar3;
  Name *pNVar4;
  Err *pEVar5;
  TableType *pTVar6;
  vector<wasm::Name,_std::allocator<wasm::Name>_> *exports_00;
  ImportNames *import_00;
  uint *puVar7;
  char cVar8;
  basic_string_view<char,_std::char_traits<char>_> bVar9;
  Ok local_619;
  Err local_618;
  Err *local_5f8;
  Err *err_7;
  undefined1 local_5e8 [8];
  Result<wasm::Ok> _val_7;
  Err *err_6;
  undefined1 local_560 [8];
  Result<wasm::Ok> _val_6;
  string local_530;
  Err local_510;
  Err local_4f0;
  Err *local_4d0;
  Err *err_5;
  Result<wasm::WATParser::TableType> _val_5;
  undefined1 local_498 [8];
  Result<wasm::WATParser::TableType> tabtype;
  Limits local_460;
  Type local_448;
  TableType local_440;
  allocator<char> local_419;
  string local_418;
  Err local_3f8;
  Err local_3d0;
  Err *local_3b0;
  Err *err_4;
  MaybeResult<wasm::Ok> _val_4;
  MaybeResult<wasm::Ok> func;
  Err local_350;
  Err *local_330;
  Err *err_3;
  MaybeResult<wasm::Ok> _val_3;
  MaybeResult<wasm::Ok> elem;
  Index local_2d0;
  bool foundElem;
  allocator<char> local_2c9;
  Index list;
  Err local_2a8;
  allocator<char> local_281;
  string local_280;
  Err local_260;
  basic_string_view<char,_std::char_traits<char>_> local_240;
  _Optional_payload_base<unsigned_int> local_230;
  optional<unsigned_int> elems;
  optional<wasm::WATParser::TableType> ttype;
  Err *err_2;
  MaybeResult<wasm::Ok> _val_2;
  MaybeResult<wasm::Ok> type;
  BasicType local_164;
  undefined1 local_160 [4];
  BasicType addressType;
  Err *local_140;
  Err *err_1;
  MaybeResult<wasm::WATParser::ImportNames> _val_1;
  MaybeResult<wasm::WATParser::ImportNames> import;
  Err local_e0;
  Err *local_c0;
  Err *err;
  undefined1 local_a8 [8];
  Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_> _val;
  Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_> exports;
  optional<wasm::Name> id;
  Name name;
  Index local_20;
  size_t pos;
  ParseDeclsCtx *ctx_local;
  
  sVar3 = Lexer::getPos(&ctx->in);
  bVar9 = sv("table",5);
  bVar1 = Lexer::takeSExprStart(&ctx->in,bVar9);
  if (!bVar1) {
    MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  wasm::Name::Name((Name *)&id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                            super__Optional_payload_base<wasm::Name>._M_engaged);
  Lexer::takeID((optional<wasm::Name> *)
                ((long)&exports.val.
                        super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                        .super__Move_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                        super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                        super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
                        super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::Err> + 0x20),&ctx->in)
  ;
  bVar1 = std::optional::operator_cast_to_bool
                    ((optional *)
                     ((long)&exports.val.
                             super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                             .super__Move_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                             super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                             super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
                             super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::Err> + 0x20));
  if (bVar1) {
    pNVar4 = std::optional<wasm::Name>::operator*
                       ((optional<wasm::Name> *)
                        ((long)&exports.val.
                                super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                                .super__Move_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                                super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                                super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
                                super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::Err> + 0x20));
    wasm::Name::operator=
              ((Name *)&id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                        super__Optional_payload_base<wasm::Name>._M_engaged,pNVar4);
  }
  __return_storage_ptr___00 =
       (__index_type *)
       ((long)&_val.val.
               super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>.
               super__Move_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
               super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
               super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
               super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::Err> + 0x20);
  inlineExports((Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_> *)
                __return_storage_ptr___00,&ctx->in);
  Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>::Result
            ((Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_> *)local_a8,
             (Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_> *)
             __return_storage_ptr___00);
  local_c0 = Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>::getErr
                       ((Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_> *)local_a8);
  bVar1 = local_c0 != (Err *)0x0;
  if (bVar1) {
    wasm::Err::Err(&local_e0,local_c0);
    MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_e0);
    wasm::Err::~Err(&local_e0);
  }
  Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>::~Result
            ((Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_> *)local_a8);
  if (bVar1) goto LAB_0232afec;
  inlineImport((MaybeResult<wasm::WATParser::ImportNames> *)
               ((long)&_val_1.val.
                       super__Variant_base<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                       .
                       super__Copy_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                       .super__Move_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err> +
               0x20),&ctx->in);
  MaybeResult<wasm::WATParser::ImportNames>::MaybeResult
            ((MaybeResult<wasm::WATParser::ImportNames> *)&err_1,
             (MaybeResult<wasm::WATParser::ImportNames> *)
             ((long)&_val_1.val.
                     super__Variant_base<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err> +
             0x20));
  local_140 = MaybeResult<wasm::WATParser::ImportNames>::getErr
                        ((MaybeResult<wasm::WATParser::ImportNames> *)&err_1);
  bVar1 = local_140 == (Err *)0x0;
  if (!bVar1) {
    wasm::Err::Err((Err *)local_160,local_140);
    MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,(Err *)local_160);
    wasm::Err::~Err((Err *)local_160);
  }
  MaybeResult<wasm::WATParser::ImportNames>::~MaybeResult
            ((MaybeResult<wasm::WATParser::ImportNames> *)&err_1);
  if (bVar1) {
    local_164 = i32;
    bVar9 = sv("i64",3);
    bVar1 = Lexer::takeKeyword(&ctx->in,bVar9);
    if (bVar1) {
      local_164 = i64;
    }
    else {
      bVar9 = sv("i32",3);
      Lexer::takeKeyword(&ctx->in,bVar9);
    }
    maybeReftype<wasm::WATParser::ParseDeclsCtx>
              ((MaybeResult<wasm::Ok> *)
               ((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20),ctx);
    MaybeResult<wasm::Ok>::MaybeResult
              ((MaybeResult<wasm::Ok> *)&err_2,
               (MaybeResult<wasm::Ok> *)
               ((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20));
    pEVar5 = MaybeResult<wasm::Ok>::getErr((MaybeResult<wasm::Ok> *)&err_2);
    if (pEVar5 != (Err *)0x0) {
      wasm::Err::Err((Err *)&ttype.super__Optional_base<wasm::WATParser::TableType,_true,_true>.
                             _M_payload.super__Optional_payload_base<wasm::WATParser::TableType>.
                             _M_engaged,pEVar5);
      MaybeResult<wasm::Ok>::MaybeResult
                (__return_storage_ptr__,
                 (Err *)&ttype.super__Optional_base<wasm::WATParser::TableType,_true,_true>.
                         _M_payload.super__Optional_payload_base<wasm::WATParser::TableType>.
                         _M_engaged);
      wasm::Err::~Err((Err *)&ttype.super__Optional_base<wasm::WATParser::TableType,_true,_true>.
                              _M_payload.super__Optional_payload_base<wasm::WATParser::TableType>.
                              _M_engaged);
    }
    MaybeResult<wasm::Ok>::~MaybeResult((MaybeResult<wasm::Ok> *)&err_2);
    if (pEVar5 == (Err *)0x0) {
      std::optional<wasm::WATParser::TableType>::optional
                ((optional<wasm::WATParser::TableType> *)&elems);
      std::optional<unsigned_int>::optional((optional<unsigned_int> *)&local_230);
      bVar1 = wasm::MaybeResult::operator_cast_to_bool
                        ((MaybeResult *)
                         ((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20));
      if (bVar1) {
        local_240 = sv("elem",4);
        bVar1 = Lexer::takeSExprStart(&ctx->in,local_240);
        if (bVar1) {
          bVar1 = wasm::MaybeResult::operator_cast_to_bool
                            ((MaybeResult *)
                             ((long)&_val_1.val.
                                     super__Variant_base<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                                     .
                                     super__Move_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                                     .
                                     super__Copy_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                                     .
                                     super__Move_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                                     .
                                     super__Copy_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                             + 0x20));
          if (bVar1) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&list,"imported tables cannot have inline elements",&local_2c9);
            Lexer::err(&local_2a8,&ctx->in,(string *)&list);
            MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_2a8);
            wasm::Err::~Err(&local_2a8);
            std::__cxx11::string::~string((string *)&list);
            std::allocator<char>::~allocator(&local_2c9);
          }
          else {
            MaybeResult<wasm::Ok>::operator*
                      ((MaybeResult<wasm::Ok> *)
                       ((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                               super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                               super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                               super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20));
            local_2d0 = ParseDeclsCtx::makeElemList(ctx);
            bVar1 = false;
            do {
              maybeElemexpr<wasm::WATParser::ParseDeclsCtx>
                        ((MaybeResult<wasm::Ok> *)
                         ((long)&_val_3.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20),ctx
                        );
              bVar2 = wasm::MaybeResult::operator_cast_to_bool
                                ((MaybeResult *)
                                 ((long)&_val_3.val.
                                         super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                         super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                         super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                         super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                         super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> +
                                 0x20));
              if (bVar2) {
                MaybeResult<wasm::Ok>::MaybeResult
                          ((MaybeResult<wasm::Ok> *)&err_3,
                           (MaybeResult<wasm::Ok> *)
                           ((long)&_val_3.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                   super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                   super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                   super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                   super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20));
                local_330 = MaybeResult<wasm::Ok>::getErr((MaybeResult<wasm::Ok> *)&err_3);
                cVar8 = local_330 != (Err *)0x0;
                if ((bool)cVar8) {
                  wasm::Err::Err(&local_350,local_330);
                  MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_350);
                  wasm::Err::~Err(&local_350);
                }
                MaybeResult<wasm::Ok>::~MaybeResult((MaybeResult<wasm::Ok> *)&err_3);
                if (!(bool)cVar8) {
                  MaybeResult<wasm::Ok>::operator*
                            ((MaybeResult<wasm::Ok> *)
                             ((long)&_val_3.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>
                                     .super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                     super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                     super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                     super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20)
                            );
                  ParseDeclsCtx::appendElem(ctx,&local_2d0);
                  bVar1 = true;
                  cVar8 = '\0';
                }
              }
              else {
                cVar8 = '\x03';
              }
              MaybeResult<wasm::Ok>::~MaybeResult
                        ((MaybeResult<wasm::Ok> *)
                         ((long)&_val_3.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20));
            } while (cVar8 == '\0');
            if (cVar8 == '\x03') {
              if (!bVar1) {
                do {
                  maybeFuncidx<wasm::WATParser::ParseDeclsCtx>
                            ((MaybeResult<wasm::Ok> *)
                             ((long)&_val_4.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>
                                     .super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                     super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                     super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                     super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20)
                             ,ctx);
                  bVar1 = wasm::MaybeResult::operator_cast_to_bool
                                    ((MaybeResult *)
                                     ((long)&_val_4.val.
                                             super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>
                                             .
                                             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>
                                             .
                                             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>
                                             .
                                             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>
                                     + 0x20));
                  if (bVar1) {
                    MaybeResult<wasm::Ok>::MaybeResult
                              ((MaybeResult<wasm::Ok> *)&err_4,
                               (MaybeResult<wasm::Ok> *)
                               ((long)&_val_4.val.
                                       super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                       super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                       super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                       super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                       super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> +
                               0x20));
                    local_3b0 = MaybeResult<wasm::Ok>::getErr((MaybeResult<wasm::Ok> *)&err_4);
                    cVar8 = local_3b0 != (Err *)0x0;
                    if ((bool)cVar8) {
                      wasm::Err::Err(&local_3d0,local_3b0);
                      MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_3d0);
                      wasm::Err::~Err(&local_3d0);
                    }
                    MaybeResult<wasm::Ok>::~MaybeResult((MaybeResult<wasm::Ok> *)&err_4);
                    if (!(bool)cVar8) {
                      MaybeResult<wasm::Ok>::operator*
                                ((MaybeResult<wasm::Ok> *)
                                 ((long)&_val_4.val.
                                         super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                         super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                         super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                         super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                         super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> +
                                 0x20));
                      ParseDeclsCtx::appendFuncElem(ctx,&local_2d0);
                      cVar8 = '\0';
                    }
                  }
                  else {
                    cVar8 = '\x05';
                  }
                  MaybeResult<wasm::Ok>::~MaybeResult
                            ((MaybeResult<wasm::Ok> *)
                             ((long)&_val_4.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>
                                     .super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                     super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                     super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                     super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20)
                            );
                } while (cVar8 == '\0');
                if (cVar8 != '\x05') goto LAB_0232afb4;
              }
              bVar1 = Lexer::takeRParen(&ctx->in);
              if (bVar1) {
                wasm::Type::Type(&local_448,local_164);
                ParseDeclsCtx::getLimitsFromElems(&local_460,ctx,local_2d0);
                MaybeResult<wasm::Ok>::operator*
                          ((MaybeResult<wasm::Ok> *)
                           ((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                   super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                   super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                   super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                   super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20));
                ParseDeclsCtx::makeTableType(&local_440,ctx,local_448.id);
                std::optional<wasm::WATParser::TableType>::operator=
                          ((optional<wasm::WATParser::TableType> *)&elems,&local_440);
                std::optional<unsigned_int>::optional<unsigned_int,_true>
                          ((optional<unsigned_int> *)
                           ((long)&tabtype.val.
                                   super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
                                   super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                                   super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                                   super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                                   super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err> +
                           0x24),&local_2d0);
                local_230 = stack0xfffffffffffffb94;
                goto LAB_0232abe1;
              }
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_418,"expected end of inline elems",&local_419);
              Lexer::err(&local_3f8,&ctx->in,&local_418);
              MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_3f8);
              wasm::Err::~Err(&local_3f8);
              std::__cxx11::string::~string((string *)&local_418);
              std::allocator<char>::~allocator(&local_419);
            }
          }
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_280,"expected table limits or inline elements",&local_281);
          Lexer::err(&local_260,&ctx->in,&local_280);
          MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_260);
          wasm::Err::~Err(&local_260);
          std::__cxx11::string::~string((string *)&local_280);
          std::allocator<char>::~allocator(&local_281);
        }
      }
      else {
        wasm::Type::Type((Type *)((long)&_val_5.val.
                                         super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
                                         super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>
                                         .
                                         super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>
                                         .
                                         super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>
                                         .
                                         super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>
                                 + 0x20),local_164);
        tabletypeContinued<wasm::WATParser::ParseDeclsCtx>
                  ((Result<wasm::WATParser::TableType> *)local_498,ctx,
                   (Type)_val_5.val.super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
                         super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                         super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                         super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                         super__Variant_storage_alias<wasm::WATParser::TableType,_wasm::Err>._32_8_)
        ;
        Result<wasm::WATParser::TableType>::Result
                  ((Result<wasm::WATParser::TableType> *)&err_5,
                   (Result<wasm::WATParser::TableType> *)local_498);
        pEVar5 = Result<wasm::WATParser::TableType>::getErr
                           ((Result<wasm::WATParser::TableType> *)&err_5);
        local_4d0 = pEVar5;
        if (pEVar5 != (Err *)0x0) {
          wasm::Err::Err(&local_4f0,pEVar5);
          MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_4f0);
          wasm::Err::~Err(&local_4f0);
        }
        Result<wasm::WATParser::TableType>::~Result((Result<wasm::WATParser::TableType> *)&err_5);
        if (pEVar5 == (Err *)0x0) {
          pTVar6 = Result<wasm::WATParser::TableType>::operator*
                             ((Result<wasm::WATParser::TableType> *)local_498);
          std::optional<wasm::WATParser::TableType>::operator=
                    ((optional<wasm::WATParser::TableType> *)&elems,pTVar6);
        }
        Result<wasm::WATParser::TableType>::~Result((Result<wasm::WATParser::TableType> *)local_498)
        ;
        if (pEVar5 == (Err *)0x0) {
LAB_0232abe1:
          bVar1 = Lexer::takeRParen(&ctx->in);
          if (bVar1) {
            exports_00 = Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>::operator*
                                   ((Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_> *
                                    )((long)&_val.val.
                                             super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                                             .
                                             super__Move_assign_alias<std::vector<wasm::Name>,_wasm::Err>
                                             .
                                             super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::Err>
                                             .
                                             super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::Err>
                                             .
                                             super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::Err>
                                     + 0x20));
            import_00 = MaybeResult<wasm::WATParser::ImportNames>::getPtr
                                  ((MaybeResult<wasm::WATParser::ImportNames> *)
                                   ((long)&_val_1.val.
                                           super__Variant_base<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                                           .
                                           super__Move_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                                           .
                                           super__Copy_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                                           .
                                           super__Move_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                                           .
                                           super__Copy_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                                   + 0x20));
            pTVar6 = std::optional<wasm::WATParser::TableType>::operator*
                               ((optional<wasm::WATParser::TableType> *)&elems);
            local_20 = (Index)sVar3;
            name_00.super_IString.str._M_str = (char *)name.super_IString.str._M_len;
            name_00.super_IString.str._M_len =
                 id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                 super__Optional_payload_base<wasm::Name>._16_8_;
            ParseDeclsCtx::addTable
                      ((Result<wasm::Ok> *)local_560,ctx,name_00,exports_00,import_00,*pTVar6,
                       local_20);
            pEVar5 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)local_560);
            if (pEVar5 != (Err *)0x0) {
              wasm::Err::Err((Err *)((long)&_val_7.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                            super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),
                             pEVar5);
              MaybeResult<wasm::Ok>::MaybeResult
                        (__return_storage_ptr__,
                         (Err *)((long)&_val_7.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                        super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                        super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                        super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
              wasm::Err::~Err((Err *)((long)&_val_7.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                             super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
            }
            Result<wasm::Ok>::~Result((Result<wasm::Ok> *)local_560);
            if (pEVar5 == (Err *)0x0) {
              bVar1 = std::optional::operator_cast_to_bool((optional *)&local_230);
              if (bVar1) {
                MaybeResult<wasm::Ok>::operator*
                          ((MaybeResult<wasm::Ok> *)
                           ((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                   super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                   super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                   super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                   super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20));
                puVar7 = std::optional<unsigned_int>::operator*
                                   ((optional<unsigned_int> *)&local_230);
                ParseDeclsCtx::addImplicitElems(local_5e8,ctx,puVar7);
                local_5f8 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)local_5e8);
                bVar1 = local_5f8 != (Err *)0x0;
                if (bVar1) {
                  wasm::Err::Err(&local_618,local_5f8);
                  MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_618);
                  wasm::Err::~Err(&local_618);
                }
                Result<wasm::Ok>::~Result((Result<wasm::Ok> *)local_5e8);
                if (bVar1) goto LAB_0232afb4;
              }
              MaybeResult<wasm::Ok>::MaybeResult<wasm::Ok>(__return_storage_ptr__,&local_619);
            }
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_530,"expected end of table declaration",
                       (allocator<char> *)
                       ((long)&_val_6.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x27));
            Lexer::err(&local_510,&ctx->in,&local_530);
            MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_510);
            wasm::Err::~Err(&local_510);
            std::__cxx11::string::~string((string *)&local_530);
            std::allocator<char>::~allocator
                      ((allocator<char> *)
                       ((long)&_val_6.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x27));
          }
        }
      }
    }
LAB_0232afb4:
    MaybeResult<wasm::Ok>::~MaybeResult
              ((MaybeResult<wasm::Ok> *)
               ((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20));
  }
  MaybeResult<wasm::WATParser::ImportNames>::~MaybeResult
            ((MaybeResult<wasm::WATParser::ImportNames> *)
             ((long)&_val_1.val.
                     super__Variant_base<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err> +
             0x20));
LAB_0232afec:
  Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>::~Result
            ((Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_> *)
             ((long)&_val.val.
                     super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                     .super__Move_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                     super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                     super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
                     super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::Err> + 0x20));
  return __return_storage_ptr__;
}

Assistant:

MaybeResult<> table(Ctx& ctx) {
  auto pos = ctx.in.getPos();
  if (!ctx.in.takeSExprStart("table"sv)) {
    return {};
  }

  Name name;
  if (auto id = ctx.in.takeID()) {
    name = *id;
  }

  auto exports = inlineExports(ctx.in);
  CHECK_ERR(exports);

  auto import = inlineImport(ctx.in);
  CHECK_ERR(import);

  auto addressType = Type::i32;
  if (ctx.in.takeKeyword("i64"sv)) {
    addressType = Type::i64;
  } else {
    ctx.in.takeKeyword("i32"sv);
  }

  // Reftype if we have inline elements.
  auto type = maybeReftype(ctx);
  CHECK_ERR(type);

  std::optional<typename Ctx::TableTypeT> ttype;
  std::optional<typename Ctx::ElemListT> elems;
  if (type) {
    // We should have inline elements.
    if (!ctx.in.takeSExprStart("elem"sv)) {
      return ctx.in.err("expected table limits or inline elements");
    }
    if (import) {
      return ctx.in.err("imported tables cannot have inline elements");
    }

    auto list = ctx.makeElemList(*type);
    bool foundElem = false;
    while (auto elem = maybeElemexpr(ctx)) {
      CHECK_ERR(elem);
      ctx.appendElem(list, *elem);
      foundElem = true;
    }

    // If there were no elemexprs, then maybe we have funcidxs instead.
    if (!foundElem) {
      while (auto func = maybeFuncidx(ctx)) {
        CHECK_ERR(func);
        ctx.appendFuncElem(list, *func);
      }
    }

    if (!ctx.in.takeRParen()) {
      return ctx.in.err("expected end of inline elems");
    }
    ttype = ctx.makeTableType(addressType, ctx.getLimitsFromElems(list), *type);
    elems = std::move(list);
  } else {
    auto tabtype = tabletypeContinued(ctx, addressType);
    CHECK_ERR(tabtype);
    ttype = *tabtype;
  }

  if (!ctx.in.takeRParen()) {
    return ctx.in.err("expected end of table declaration");
  }

  CHECK_ERR(ctx.addTable(name, *exports, import.getPtr(), *ttype, pos));

  if (elems) {
    CHECK_ERR(ctx.addImplicitElems(*type, std::move(*elems)));
  }

  return Ok{};
}